

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::BrandScope_*> *this,size_t newSize)

{
  BrandScope **ppBVar1;
  BrandScope **ppBVar2;
  RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *ppBVar3;
  ulong __n;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> local_38;
  
  ppBVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppBVar1 >> 3)) {
    (this->builder).pos = ppBVar1 + newSize;
  }
  local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  ppBVar1 = (this->builder).ptr;
  ppBVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (ppBVar1 != ppBVar2) {
    __n = (long)ppBVar2 - (long)ppBVar1 & 0xfffffffffffffff8;
    memcpy(local_38.pos,ppBVar1,__n);
    local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)
                   ((long)local_38.pos + __n);
  }
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::operator=(&this->builder,&local_38);
  ppBVar2 = local_38.endPtr;
  ppBVar3 = local_38.pos;
  ppBVar1 = local_38.ptr;
  if (local_38.ptr != (BrandScope **)0x0) {
    local_38.ptr = (BrandScope **)0x0;
    local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)0x0;
    local_38.endPtr = (BrandScope **)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,ppBVar1,8,(long)ppBVar3 - (long)ppBVar1 >> 3,
               (long)ppBVar2 - (long)ppBVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }